

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-ttl.c
# Opt level: O1

int run_test_udp_multicast_ttl(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar6;
  bool bVar7;
  uv_udp_t *puVar8;
  uv_handle_t *handle;
  int64_t eval_b_4;
  int64_t eval_b_5;
  int64_t eval_b;
  sockaddr_in addr;
  uv_udp_send_t req;
  undefined1 auStack_1a8 [40];
  undefined1 local_180 [16];
  uv_buf_t local_170;
  sockaddr_in local_160;
  uv_udp_send_t local_150;
  
  local_170.len = (size_t)local_170.base;
  auStack_1a8._24_8_ = (uv_close_cb)0x1db01d;
  puVar6 = uv_default_loop();
  auStack_1a8._24_8_ = (uv_close_cb)0x1db02c;
  iVar5 = uv_udp_init(puVar6,&server);
  local_150.data = (void *)(long)iVar5;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_170.len;
  local_170 = (uv_buf_t)(auVar4 << 0x40);
  if (local_150.data == (void *)0x0) {
    auStack_1a8._24_8_ = (uv_close_cb)0x1db05f;
    iVar5 = uv_ip4_addr("0.0.0.0",0,&local_160);
    local_150.data = (void *)(long)iVar5;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_170.len;
    local_170 = (uv_buf_t)(auVar1 << 0x40);
    if (local_150.data != (void *)0x0) goto LAB_001db28d;
    auStack_1a8._24_8_ = (uv_close_cb)0x1db092;
    iVar5 = uv_udp_bind(&server,(sockaddr *)&local_160,0);
    local_150.data = (void *)(long)iVar5;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_170.len;
    local_170 = (uv_buf_t)(auVar2 << 0x40);
    if (local_150.data != (void *)0x0) goto LAB_001db29c;
    auStack_1a8._24_8_ = (uv_close_cb)0x1db0c3;
    iVar5 = uv_udp_set_multicast_ttl(&server,0x20);
    local_150.data = (void *)(long)iVar5;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_170.len;
    local_170 = (uv_buf_t)(auVar3 << 0x40);
    if (local_150.data != (void *)0x0) goto LAB_001db2ab;
    auStack_1a8._24_8_ = (uv_close_cb)0x1db0f4;
    local_170 = uv_buf_init("PING",4);
    auStack_1a8._24_8_ = (uv_close_cb)0x1db114;
    iVar5 = uv_ip4_addr("239.255.0.1",0x23a3,&local_160);
    local_150.data = (void *)(long)iVar5;
    local_180._0_8_ = (uv_handle_t *)0x0;
    if (local_150.data != (void *)0x0) goto LAB_001db2ba;
    auStack_1a8._24_8_ = (uv_close_cb)0x1db15b;
    iVar5 = uv_udp_send(&local_150,&server,&local_170,1,(sockaddr *)&local_160,sv_send_cb);
    local_180._0_8_ = SEXT48(iVar5);
    local_180._8_8_ = (uv_handle_t *)0x0;
    if ((uv_handle_t *)local_180._0_8_ != (uv_handle_t *)0x0) goto LAB_001db2c9;
    local_180._0_8_ = SEXT48(close_cb_called);
    local_180._8_8_ = (uv_handle_t *)0x0;
    if ((uv_handle_t *)local_180._0_8_ != (uv_handle_t *)0x0) goto LAB_001db2d8;
    local_180._0_8_ = SEXT48(sv_send_cb_called);
    local_180._8_8_ = (uv_handle_t *)0x0;
    if ((uv_handle_t *)local_180._0_8_ != (uv_handle_t *)0x0) goto LAB_001db2e7;
    auStack_1a8._24_8_ = (uv_close_cb)0x1db1ca;
    puVar6 = uv_default_loop();
    auStack_1a8._24_8_ = (uv_close_cb)0x1db1d4;
    uv_run(puVar6,UV_RUN_DEFAULT);
    local_180._0_8_ = (uv_handle_t *)0x1;
    local_180._8_8_ = SEXT48(sv_send_cb_called);
    if ((uv_handle_t *)local_180._8_8_ != (uv_handle_t *)0x1) goto LAB_001db2f6;
    local_180._0_8_ = (uv_handle_t *)0x1;
    local_180._8_8_ = SEXT48(close_cb_called);
    if ((uv_handle_t *)local_180._8_8_ != (uv_handle_t *)0x1) goto LAB_001db305;
    auStack_1a8._24_8_ = (uv_close_cb)0x1db223;
    puVar6 = uv_default_loop();
    auStack_1a8._24_8_ = (uv_close_cb)0x1db237;
    uv_walk(puVar6,close_walk_cb,(void *)0x0);
    auStack_1a8._24_8_ = (uv_close_cb)0x1db241;
    uv_run(puVar6,UV_RUN_DEFAULT);
    local_180._0_8_ = (uv_handle_t *)0x0;
    auStack_1a8._24_8_ = (uv_close_cb)0x1db24f;
    puVar6 = uv_default_loop();
    auStack_1a8._24_8_ = (uv_close_cb)0x1db257;
    iVar5 = uv_loop_close(puVar6);
    local_180._8_8_ = SEXT48(iVar5);
    if (local_180._0_8_ == local_180._8_8_) {
      auStack_1a8._24_8_ = (uv_close_cb)0x1db273;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_1a8._24_8_ = (uv_close_cb)0x1db28d;
    run_test_udp_multicast_ttl_cold_1();
LAB_001db28d:
    auStack_1a8._24_8_ = (uv_close_cb)0x1db29c;
    run_test_udp_multicast_ttl_cold_2();
LAB_001db29c:
    auStack_1a8._24_8_ = (uv_close_cb)0x1db2ab;
    run_test_udp_multicast_ttl_cold_3();
LAB_001db2ab:
    auStack_1a8._24_8_ = (uv_close_cb)0x1db2ba;
    run_test_udp_multicast_ttl_cold_4();
LAB_001db2ba:
    auStack_1a8._24_8_ = (uv_close_cb)0x1db2c9;
    run_test_udp_multicast_ttl_cold_5();
LAB_001db2c9:
    auStack_1a8._24_8_ = (uv_close_cb)0x1db2d8;
    run_test_udp_multicast_ttl_cold_6();
LAB_001db2d8:
    auStack_1a8._24_8_ = (uv_close_cb)0x1db2e7;
    run_test_udp_multicast_ttl_cold_7();
LAB_001db2e7:
    auStack_1a8._24_8_ = (uv_close_cb)0x1db2f6;
    run_test_udp_multicast_ttl_cold_8();
LAB_001db2f6:
    auStack_1a8._24_8_ = (uv_close_cb)0x1db305;
    run_test_udp_multicast_ttl_cold_9();
LAB_001db305:
    auStack_1a8._24_8_ = (uv_close_cb)0x1db314;
    run_test_udp_multicast_ttl_cold_10();
  }
  puVar8 = (uv_udp_t *)(auStack_1a8 + 0x28);
  iVar5 = (int)auStack_1a8 + 0x30;
  auStack_1a8._24_8_ = sv_send_cb;
  run_test_udp_multicast_ttl_cold_11();
  if (puVar8 == (uv_udp_t *)0x0) {
    auStack_1a8._0_8_ = (void *)0x1db391;
    sv_send_cb_cold_3();
  }
  else {
    if ((1 < iVar5 + 1U) && (iVar5 != -0x65)) goto LAB_001db3a0;
    puVar8 = (uv_udp_t *)puVar8->send_queue_count;
    auStack_1a8._24_8_ = ZEXT18(puVar8 == &client || puVar8 == &server);
    auStack_1a8._16_8_ = 0;
    if ((uv_close_cb)auStack_1a8._24_8_ != (uv_close_cb)0x0) {
      sv_send_cb_called = sv_send_cb_called + 1;
      uv_close((uv_handle_t *)puVar8,close_cb);
      return extraout_EAX;
    }
  }
  puVar8 = (uv_udp_t *)(auStack_1a8 + 0x18);
  auStack_1a8._0_8_ = (void *)0x1db3a0;
  sv_send_cb_cold_1();
LAB_001db3a0:
  auStack_1a8._0_8_ = close_cb;
  sv_send_cb_cold_2();
  bVar7 = puVar8 == &client || puVar8 == &server;
  auStack_1a8._0_8_ = ZEXT18(bVar7);
  if ((void *)auStack_1a8._0_8_ != (void *)0x0) {
    close_cb_called = close_cb_called + 1;
    return (int)bVar7;
  }
  handle = (uv_handle_t *)auStack_1a8;
  close_cb_cold_1();
  iVar5 = uv_is_closing(handle);
  if (iVar5 != 0) {
    return iVar5;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(udp_multicast_ttl) {
  int r;
  uv_udp_send_t req;
  uv_buf_t buf;
  struct sockaddr_in addr;

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  ASSERT_OK(uv_ip4_addr("0.0.0.0", 0, &addr));
  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_udp_set_multicast_ttl(&server, 32);
  ASSERT_OK(r);

  /* server sends "PING" */
  buf = uv_buf_init("PING", 4);
  ASSERT_OK(uv_ip4_addr("239.255.0.1", TEST_PORT, &addr));
  r = uv_udp_send(&req,
                  &server,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  sv_send_cb);
  ASSERT_OK(r);

  ASSERT_OK(close_cb_called);
  ASSERT_OK(sv_send_cb_called);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, sv_send_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}